

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

float __thiscall
xatlas::internal::segment::Atlas::computeArea(Atlas *this,Chart *chart,uint32_t firstFace)

{
  char *__function;
  uint32_t uVar1;
  float fVar2;
  
  fVar2 = chart->area;
  uVar1 = firstFace;
  do {
    if ((this->m_faceAreas).m_base.size <= uVar1) {
      __function = "const T &xatlas::internal::Array<float>::operator[](uint32_t) const [T = float]"
      ;
LAB_001b2603:
      __assert_fail("index < m_base.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                    ,0x4a8,__function);
    }
    if ((this->m_nextPlanarRegionFace).m_base.size <= uVar1) {
      __function = 
      "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]"
      ;
      goto LAB_001b2603;
    }
    fVar2 = fVar2 + *(float *)((this->m_faceAreas).m_base.buffer + (ulong)uVar1 * 4);
    uVar1 = *(uint32_t *)((this->m_nextPlanarRegionFace).m_base.buffer + (ulong)uVar1 * 4);
    if (uVar1 == firstFace) {
      return fVar2;
    }
  } while( true );
}

Assistant:

float computeArea(Chart *chart, uint32_t firstFace) const
	{
		float area = chart->area;
		uint32_t face = firstFace;
		for (;;) { 
			area += m_faceAreas[face];
			face = m_nextPlanarRegionFace[face];
			if (face == firstFace)
				break;
		}
		return area;
	}